

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
::clear_to_size(dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                *this,size_type new_num_buckets)

{
  pointer ppcVar1;
  pointer ppcVar2;
  ulong uVar3;
  size_type sVar4;
  float fVar5;
  
  if (this->table == (pointer)0x0) {
    ppcVar2 = (pointer)malloc(new_num_buckets * 8);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_00a674f4;
    ppcVar2 = alloc_impl<google::libc_allocator_with_realloc<const_char_*>_>::realloc_or_die
                        ((alloc_impl<google::libc_allocator_with_realloc<const_char_*>_> *)
                         &this->field_0x48,this->table,new_num_buckets);
  }
  this->table = ppcVar2;
LAB_00a674f4:
  if (new_num_buckets != 0) {
    ppcVar1 = this->table;
    sVar4 = 0;
    do {
      ppcVar1[sVar4] = (this->key_info).empty_key;
      sVar4 = sVar4 + 1;
    } while (new_num_buckets != sVar4);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar5 = (this->settings).
          super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar3 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar5 = (float)new_num_buckets *
          (this->settings).
          super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
          shrink_factor_;
  uVar3 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }